

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle_private.hh
# Opt level: O0

shared_ptr<QPDFObject> __thiscall
QPDFObject::create<QPDF_Real,double&,int&,bool&>
          (QPDFObject *this,double *args,int *args_1,bool *args_2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar1;
  QPDF_Real local_48;
  bool *local_28;
  bool *args_local_2;
  int *args_local_1;
  double *args_local;
  
  local_28 = args_2;
  args_local_2 = (bool *)args_1;
  args_local_1 = (int *)args;
  args_local = (double *)this;
  QPDF_Real::QPDF_Real(&local_48,*args,*args_1,(bool)(*args_2 & 1));
  std::make_shared<QPDFObject,QPDF_Real>((QPDF_Real *)this);
  QPDF_Real::~QPDF_Real(&local_48);
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<QPDFObject>)sVar1.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<QPDFObject>
QPDFObject::create(Args&&... args)
{
    return std::make_shared<QPDFObject>(std::forward<T>(T(std::forward<Args>(args)...)));
}